

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helics-broker.cpp
# Opt level: O2

void terminalFunction(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args)

{
  bool bVar1;
  App *pAVar2;
  App *this;
  App *this_00;
  Option *pOVar3;
  allocator<char> local_932;
  bool cmdcont;
  string target;
  string query;
  string cmdin;
  __single_object broker;
  App *restart;
  anon_class_8_1_4ed96917 status;
  _Any_data local_8b8;
  code *local_8a8;
  code *pcStack_8a0;
  _Any_data local_898;
  code *local_888;
  code *pcStack_880;
  _Any_data local_878;
  code *local_868;
  code *pcStack_860;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  _Any_data local_4b0;
  code *local_4a0;
  code *local_498;
  _Any_data local_490;
  code *local_480;
  code *local_478;
  _Any_data local_470;
  code *local_460;
  code *local_458;
  _Any_data local_450;
  code *local_440;
  code *local_438;
  _Any_data local_430;
  code *local_420;
  code *local_418;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  helicsCLI11App termProg;
  
  std::operator<<((ostream *)&std::cout,"starting broker\n");
  std::
  make_unique<helics::BrokerApp,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&broker);
  cmdcont = true;
  status.broker = &broker;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"helics broker command line terminal",(allocator<char> *)&query);
  std::__cxx11::string::string<std::allocator<char>>((string *)&target,"",(allocator<char> *)&cmdin)
  ;
  helics::helicsCLI11App::helicsCLI11App(&termProg,&local_4d0,&target);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&local_4d0);
  CLI::App::ignore_case(&termProg.super_App,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f0,"-q{false},--quit{false},--exit{false}",(allocator<char> *)&target
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"close the terminal and wait for the broker to exit",
             (allocator<char> *)&query);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&termProg.super_App,&local_4f0,&cmdcont,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_530,"quit",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_550,"close the terminal and  wait for the broker to exit",
             (allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_530,&local_550);
  local_3f0._8_8_ = 0;
  local_3d8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:236:20)>
              ::_M_invoke;
  local_3e0 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:236:20)>
              ::_M_manager;
  local_3f0._M_unused._0_8_ = (undefined8)&cmdcont;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_3f0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_570,"terminate",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_590,"terminate the broker",(allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_570,&local_590);
  local_410._8_8_ = 0;
  local_3f8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:172:24)>
              ::_M_invoke;
  local_400 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:172:24)>
              ::_M_manager;
  local_410._M_unused._M_object =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&broker;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_410);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_410);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"terminate!",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d0,"forcibly terminate the broker and exit",(allocator<char> *)&query
            );
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_5b0,&local_5d0);
  local_418 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:240:20)>
              ::_M_invoke;
  local_420 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:240:20)>
              ::_M_manager;
  local_430._M_unused._M_object =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&broker;
  local_430._8_8_ = &cmdcont;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_430);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_430);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"restart",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_610,"restart the broker if it is not currently executing",
             (allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_5f0,&local_610);
  pAVar2->allow_extras_ = true;
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_5f0);
  local_878._M_unused._M_object = (void *)0x0;
  local_878._8_8_ = 0;
  local_868 = (code *)0x0;
  pcStack_860 = (code *)0x0;
  restart = pAVar2;
  local_878._M_unused._M_object = operator_new(0x18);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)local_878._M_unused._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&broker;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)local_878._M_unused._0_8_ + 8) = args;
  *(App ***)((long)local_878._M_unused._0_8_ + 0x10) = &restart;
  pcStack_860 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:248:23)>
                ::_M_invoke;
  local_868 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:248:23)>
              ::_M_manager;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_878);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_878);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_630,"restart!",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_650,"forcibly terminate the broker and restart it",
             (allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_630,&local_650);
  pAVar2->allow_extras_ = true;
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_630);
  local_898._M_unused._M_object = (void *)0x0;
  local_898._8_8_ = 0;
  local_888 = (code *)0x0;
  pcStack_880 = (code *)0x0;
  local_898._M_unused._M_object = operator_new(0x18);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)local_898._M_unused._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&broker;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)local_898._M_unused._0_8_ + 8) = args;
  *(App ***)((long)local_898._M_unused._0_8_ + 0x10) = &restart;
  pcStack_880 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:256:9)>
                ::_M_invoke;
  local_888 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:256:9)>
              ::_M_manager;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_898);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_670,"status",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_690,"generate the current status of the broker",
             (allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_670,&local_690);
  local_450._8_8_ = 0;
  local_438 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:259:20)>
              ::_M_invoke;
  local_440 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:259:20)>
              ::_M_manager;
  local_450._M_unused._M_object = &status;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_450);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_450);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6b0,"info",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"get the current broker status and connection info",
             (allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_6b0,&local_6d0);
  local_470._8_8_ = 0;
  local_458 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:261:20)>
              ::_M_invoke;
  local_460 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:261:20)>
              ::_M_manager;
  local_470._M_unused._M_object = &status;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_470);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_470);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"help",(allocator<char> *)&target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_710,"display the help",(allocator<char> *)&query);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_6f0,&local_710);
  local_490._8_8_ = 0;
  local_478 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:262:67)>
              ::_M_invoke;
  local_480 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:262:67)>
              ::_M_manager;
  local_490._M_unused._0_8_ = (undefined8)&termProg;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_490);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_490);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_6f0);
  target._M_dataplus._M_p = (pointer)&target.field_2;
  target._M_string_length = 0;
  target.field_2._M_local_buf[0] = '\0';
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  query.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_730,"query",(allocator<char> *)&cmdin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_750,
             "make a query of some target >>query <target> <query> or query <query> to query the broker"
             ,&local_932);
  pAVar2 = CLI::App::add_subcommand(&termProg.super_App,&local_730,&local_750);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"targetGroup",(allocator<char> *)&cmdin);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"",&local_932);
  this = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_770,&local_790)->super_App;
  this->default_startup = enabled;
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"target",(allocator<char> *)&cmdin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7d0,"the name of object to target",&local_932);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this,&local_7b0,&target,&local_7d0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7f0,"queryGroup",(allocator<char> *)&cmdin);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_810,"",&local_932);
  this_00 = &CLI::App::add_option_group<CLI::Option_group>(pAVar2,&local_7f0,&local_810)->super_App;
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_830,"query",(allocator<char> *)&cmdin);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,"the query to make",&local_932);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (this_00,&local_830,&query,&local_850);
  (pOVar3->super_OptionBase<CLI::Option>).required_ = true;
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_830);
  local_498 = CLI::std::
              _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:292:33)>
              ::_M_invoke;
  local_4a0 = CLI::std::
              _Function_handler<void_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:292:33)>
              ::_M_manager;
  local_4b0._M_unused._0_8_ = (undefined8)this;
  local_4b0._8_8_ = &target;
  CLI::std::function<void_(unsigned_long)>::operator=
            (&pAVar2->pre_parse_callback_,(function<void_(unsigned_long)> *)&local_4b0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_4b0);
  local_8a8 = (code *)0x0;
  pcStack_8a0 = (code *)0x0;
  local_8b8._M_unused._M_object = (void *)0x0;
  local_8b8._8_8_ = 0;
  local_8b8._M_unused._M_object = operator_new(0x18);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)local_8b8._M_unused._0_8_ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&broker;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   ((long)local_8b8._M_unused._0_8_ + 8) = &target;
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
   ((long)local_8b8._M_unused._0_8_ + 0x10) = &query;
  pcStack_8a0 = CLI::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:268:22)>
                ::_M_invoke;
  local_8a8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:268:22)>
              ::_M_manager;
  CLI::App::callback(pAVar2,(function<void_()> *)&local_8b8);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_8b8);
  do {
    if (cmdcont != true) {
      std::__cxx11::string::~string((string *)&query);
      std::__cxx11::string::~string((string *)&target);
      helics::helicsCLI11App::~helicsCLI11App(&termProg);
      CLI::std::unique_ptr<helics::BrokerApp,_std::default_delete<helics::BrokerApp>_>::~unique_ptr
                (&broker);
      return;
    }
    cmdin._M_string_length = 0;
    cmdin.field_2._M_local_buf[0] = '\0';
    cmdin._M_dataplus._M_p = (pointer)&cmdin.field_2;
    std::operator<<((ostream *)&std::cout,"\nhelics_broker>>");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&cmdin);
    bVar1 = std::operator==(&cmdin,"exit");
    if (bVar1) {
LAB_00172e43:
      cmdcont = false;
    }
    else {
      bVar1 = std::operator==(&cmdin,"q");
      if (bVar1) goto LAB_00172e43;
      helics::helicsCLI11App::helics_parse<std::__cxx11::string&>(&termProg,&cmdin);
    }
    std::__cxx11::string::~string((string *)&cmdin);
  } while( true );
}

Assistant:

void terminalFunction(std::vector<std::string> args)
{
    std::cout << "starting broker\n";
    auto broker = std::make_unique<helics::BrokerApp>(args);
    auto closeBroker = [&broker]() {
        if (!broker) {
            std::cout << "Broker has terminated\n";
            return;
        }
        broker->forceTerminate();
        while (broker->isConnected()) {
            std::this_thread::sleep_for(std::chrono::milliseconds(100));
        }
        std::cout << "Broker has terminated\n";
    };

    auto restartBroker = [&broker, &args](const std::vector<std::string>& broker_args, bool force) {
        if (!broker_args.empty()) {
            args = broker_args;
        }
        if (!broker) {
            broker = std::make_unique<helics::BrokerApp>(args);
            std::cout << "broker has started\n";
        } else if (broker->isConnected()) {
            if (force) {
                broker->forceTerminate();
                broker = nullptr;
                broker = std::make_unique<helics::BrokerApp>(args);
                std::cout << "broker was forcibly terminated and restarted\n";
            } else {
                std::cout << "broker is currently running unable to restart\n";
            }
        } else {
            broker = nullptr;
            broker = std::make_unique<helics::BrokerApp>(args);
            std::cout << "broker has restarted\n";
        }
    };

    auto status = [&broker](bool addAddress) {
        if (!broker) {
            std::cout << "Broker is not available\n";
            return;
        }
        auto accepting = (*broker)->isOpenToNewFederates();
        auto connected = (*broker)->isConnected();
        auto id = (*broker)->getIdentifier();
        if (connected) {
            std::cout << "Broker (" << id << ") is connected and "
                      << ((accepting) ? "is" : "is not") << "accepting new federates\n";
            if (addAddress) {
                auto address = (*broker)->getAddress();
                std::cout << address << '\n';
            } else {
                auto cts = (*broker)->query("broker", "counts");
                std::cout << cts << '\n';
            }
        } else {
            std::cout << "Broker (" << id << ") is not connected \n";
        }
    };
    bool cmdcont = true;
    helics::helicsCLI11App termProg("helics broker command line terminal");
    termProg.ignore_case();
    termProg.add_flag("-q{false},--quit{false},--exit{false}",
                      cmdcont,
                      "close the terminal and wait for the broker to exit");
    termProg.add_subcommand("quit", "close the terminal and  wait for the broker to exit")
        ->callback([&cmdcont]() { cmdcont = false; });
    termProg.add_subcommand("terminate", "terminate the broker")->callback(closeBroker);

    termProg.add_subcommand("terminate!", "forcibly terminate the broker and exit")
        ->callback([closeBroker, &cmdcont]() {
            cmdcont = false;
            closeBroker();
        });

    auto* restart =
        termProg.add_subcommand("restart", "restart the broker if it is not currently executing")
            ->allow_extras();
    restart->callback([restartBroker, &restart]() {
        restartBroker(restart->remaining_for_passthrough(), false);
    });

    auto* frestart =
        termProg.add_subcommand("restart!", "forcibly terminate the broker and restart it")
            ->allow_extras();
    frestart->callback(
        [restartBroker, &restart]() { restartBroker(restart->remaining_for_passthrough(), true); });

    termProg.add_subcommand("status", "generate the current status of the broker")
        ->callback([&status]() { status(false); });
    termProg.add_subcommand("info", "get the current broker status and connection info")
        ->callback([&status]() { status(true); });
    termProg.add_subcommand("help", "display the help")->callback([&termProg]() {
        termProg.helics_parse("-?");
    });
    std::string target;
    std::string query;

    auto queryCall = [&broker, &target, &query]() {
        if (!broker) {
            std::cout << "Broker is not available\n";
            return;
        }
        std::string res;
        if (target.empty()) {
            res = (*broker)->query("broker", query);
        } else {
            res = (*broker)->query(target, query);
        }
        auto qvec = helics::vectorizeQueryResult(std::move(res));
        std::cout << "results: ";
        for (const auto& vres : qvec) {
            std::cout << vres << '\n';
        }
    };
    auto* querySub = termProg.add_subcommand(
        "query",
        "make a query of some target >>query <target> <query> or query <query> to query the broker");
    auto* qgroup1 = querySub->add_option_group("targetGroup")->enabled_by_default();
    qgroup1->add_option("target", target, "the name of object to target");
    auto* qgroup2 = querySub->add_option_group("queryGroup");
    qgroup2->add_option("query", query, "the query to make")->required();
    querySub->preparse_callback([qgroup1, &target](size_t argcount) {
        if (argcount < 2) {
            target.clear();
            qgroup1->disabled();
        }
    });
    querySub->callback(queryCall);
    while (cmdcont) {
        std::string cmdin;
        std::cout << "\nhelics_broker>>";
        std::getline(std::cin, cmdin);
        if (cmdin == "exit" || cmdin == "q") {  // provide a fast path to exit without going through
                                                // the terminal command line processor
            cmdcont = false;
            continue;
        }
        termProg.helics_parse(cmdin);
    }
}